

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

void __thiscall btSoftBody::applyClusters(btSoftBody *this,bool drift)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  Cluster **ppCVar6;
  Cluster *pCVar7;
  Node *pNVar8;
  Node **ppNVar9;
  Node *pNVar10;
  uint uVar11;
  btVector3 *pbVar12;
  float *pfVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  btScalar *pbVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  btAlignedObjectArray<float> weights;
  btAlignedObjectArray<btVector3> deltas;
  btAlignedObjectArray<float> local_78;
  btAlignedObjectArray<btVector3> local_58;
  long local_38;
  
  CProfileManager::Start_Profile("ApplyClusters");
  local_58.m_ownsMemory = true;
  local_58.m_data = (btVector3 *)0x0;
  local_58.m_size = 0;
  local_58.m_capacity = 0;
  local_78.m_ownsMemory = true;
  local_78.m_data = (float *)0x0;
  local_78.m_size = 0;
  local_78.m_capacity = 0;
  uVar11 = (this->m_nodes).m_size;
  lVar16 = (long)(int)uVar11;
  uVar20 = uVar11;
  uVar21 = 0;
  if (lVar16 < 0) {
LAB_001dd751:
    local_58.m_ownsMemory = true;
    local_58.m_size = uVar11;
    if ((int)uVar21 < (int)uVar20) {
      if (local_78.m_capacity < (int)uVar20) {
        if (uVar20 == 0) {
          pfVar13 = (float *)0x0;
          uVar11 = uVar21;
        }
        else {
          pfVar13 = (float *)btAlignedAllocInternal((long)(int)uVar20 * 4,0x10);
          uVar11 = local_78.m_size;
        }
        if ((int)uVar11 < 1) {
          if (local_78.m_data != (float *)0x0) goto LAB_001dd7c0;
        }
        else {
          uVar15 = 0;
          do {
            pfVar13[uVar15] = local_78.m_data[uVar15];
            uVar15 = uVar15 + 1;
          } while (uVar11 != uVar15);
LAB_001dd7c0:
          if (local_78.m_ownsMemory == true) {
            btAlignedFreeInternal(local_78.m_data);
          }
        }
        local_78.m_ownsMemory = true;
        local_78.m_capacity = uVar20;
        local_78.m_data = pfVar13;
      }
      memset(local_78.m_data + (int)uVar21,0,((long)(int)uVar20 - (long)(int)uVar21) * 4);
    }
  }
  else {
    if (uVar11 != 0) {
      pbVar12 = (btVector3 *)btAlignedAllocInternal(lVar16 << 4,0x10);
      if ((long)local_58.m_size < 1) {
        if (local_58.m_data != (btVector3 *)0x0) goto LAB_001dd70b;
      }
      else {
        lVar14 = 0;
        do {
          puVar1 = (undefined8 *)((long)(local_58.m_data)->m_floats + lVar14);
          uVar4 = puVar1[1];
          puVar2 = (undefined8 *)((long)pbVar12->m_floats + lVar14);
          *puVar2 = *puVar1;
          puVar2[1] = uVar4;
          lVar14 = lVar14 + 0x10;
        } while ((long)local_58.m_size * 0x10 != lVar14);
LAB_001dd70b:
        if (local_58.m_ownsMemory == true) {
          btAlignedFreeInternal(local_58.m_data);
        }
      }
      local_58._4_8_ = (ulong)uVar11 << 0x20;
      lVar14 = 0;
      do {
        puVar1 = (undefined8 *)((long)pbVar12->m_floats + lVar14);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar14 = lVar14 + 0x10;
        lVar16 = lVar16 + -1;
      } while (lVar16 != 0);
      uVar20 = (this->m_nodes).m_size;
      uVar21 = local_78.m_size;
      local_58.m_data = pbVar12;
      goto LAB_001dd751;
    }
    local_58.m_size = 0;
    local_58.m_capacity = 0;
    uVar20 = 0;
  }
  local_78.m_size = uVar20;
  uVar11 = (this->m_clusters).m_size;
  if (drift) {
    if ((int)uVar11 < 1) goto LAB_001dda4e;
    ppCVar6 = (this->m_clusters).m_data;
    uVar15 = 0;
    do {
      pCVar7 = ppCVar6[uVar15];
      if (pCVar7->m_ndimpulses != 0) {
        fVar22 = 1.0 / (float)pCVar7->m_ndimpulses;
        uVar4 = *(undefined8 *)pCVar7->m_dimpulses[0].m_floats;
        uVar5 = *(undefined8 *)pCVar7->m_dimpulses[1].m_floats;
        *(ulong *)pCVar7->m_dimpulses[0].m_floats =
             CONCAT44((float)((ulong)uVar4 >> 0x20) * fVar22,(float)uVar4 * fVar22);
        pCVar7->m_dimpulses[0].m_floats[2] = pCVar7->m_dimpulses[0].m_floats[2] * fVar22;
        *(ulong *)pCVar7->m_dimpulses[1].m_floats =
             CONCAT44((float)((ulong)uVar5 >> 0x20) * fVar22,(float)uVar5 * fVar22);
        pCVar7->m_dimpulses[1].m_floats[2] = fVar22 * pCVar7->m_dimpulses[1].m_floats[2];
      }
      uVar15 = uVar15 + 1;
    } while (uVar11 != uVar15);
  }
  if (0 < (int)uVar11) {
    ppCVar6 = (this->m_clusters).m_data;
    uVar15 = (ulong)drift;
    local_38 = uVar15 * 0x20 + 0x118;
    pNVar8 = (this->m_nodes).m_data;
    uVar19 = 0;
    do {
      pCVar7 = ppCVar6[uVar19];
      if ((0 < (int)(pCVar7->m_lv).m_floats[(ulong)drift - 2]) &&
         (lVar16 = (long)(pCVar7->m_nodes).m_size, 0 < lVar16)) {
        fVar22 = (this->m_sst).sdt;
        fVar24 = pCVar7->m_vimpulses[uVar15 * 2].m_floats[2];
        fVar23 = pCVar7->m_vimpulses[uVar15 * 2 + 1].m_floats[0] * fVar22;
        uVar4 = *(undefined8 *)pCVar7->m_vimpulses[uVar15 * 2].m_floats;
        uVar5 = *(undefined8 *)(pCVar7->m_dimpulses[uVar15 * 2 + -1].m_floats + 1);
        fVar25 = (float)uVar5 * fVar22;
        fVar26 = (float)((ulong)uVar5 >> 0x20) * fVar22;
        pfVar13 = (pCVar7->m_masses).m_data;
        ppNVar9 = (pCVar7->m_nodes).m_data;
        lVar14 = 0;
        do {
          pNVar10 = ppNVar9[lVar14];
          fVar3 = pfVar13[lVar14];
          iVar18 = (int)((ulong)((long)pNVar10 - (long)pNVar8) >> 3) * -0x11111111;
          fVar27 = (pNVar10->m_x).m_floats[1] - (pCVar7->m_com).m_floats[1];
          fVar28 = (pNVar10->m_x).m_floats[2] - (pCVar7->m_com).m_floats[2];
          fVar29 = (pNVar10->m_x).m_floats[0] - (pCVar7->m_com).m_floats[0];
          *(ulong *)local_58.m_data[iVar18].m_floats =
               CONCAT44((float)((ulong)*(undefined8 *)local_58.m_data[iVar18].m_floats >> 0x20) +
                        fVar3 * (fVar26 * fVar29 + fVar28 * -fVar23 +
                                (float)((ulong)uVar4 >> 0x20) * fVar22),
                        (float)*(undefined8 *)local_58.m_data[iVar18].m_floats +
                        fVar3 * (fVar25 * fVar28 + fVar27 * -fVar26 + (float)uVar4 * fVar22));
          local_58.m_data[iVar18].m_floats[2] =
               (fVar27 * fVar23 + fVar29 * -fVar25 + fVar24 * fVar22) * fVar3 +
               local_58.m_data[iVar18].m_floats[2];
          local_78.m_data[iVar18] = fVar3 + local_78.m_data[iVar18];
          lVar14 = lVar14 + 1;
        } while (lVar16 != lVar14);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar11);
  }
LAB_001dda4e:
  if (0 < (long)local_58.m_size) {
    pbVar17 = (((this->m_nodes).m_data)->m_x).m_floats + 2;
    lVar16 = 0;
    do {
      if (0.0 < *(float *)((long)local_78.m_data + lVar16)) {
        fVar24 = 1.0 / *(float *)((long)local_78.m_data + lVar16);
        fVar22 = (local_58.m_data)->m_floats[lVar16 + 2];
        *(ulong *)((btVector3 *)(pbVar17 + -2))->m_floats =
             CONCAT44((float)((ulong)*(undefined8 *)((btVector3 *)(pbVar17 + -2))->m_floats >> 0x20)
                      + fVar24 * (float)((ulong)*(undefined8 *)
                                                 ((local_58.m_data)->m_floats + lVar16) >> 0x20),
                      (float)*(undefined8 *)((btVector3 *)(pbVar17 + -2))->m_floats +
                      fVar24 * (float)*(undefined8 *)((local_58.m_data)->m_floats + lVar16));
        *pbVar17 = fVar22 * fVar24 + *pbVar17;
      }
      lVar16 = lVar16 + 4;
      pbVar17 = pbVar17 + 0x1e;
    } while ((long)local_58.m_size * 4 != lVar16);
  }
  btAlignedObjectArray<float>::~btAlignedObjectArray(&local_78);
  btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&local_58);
  CProfileManager::Stop_Profile();
  return;
}

Assistant:

void					btSoftBody::applyClusters(bool drift)
{
	BT_PROFILE("ApplyClusters");
//	const btScalar					f0=m_sst.sdt;
	//const btScalar					f1=f0/2;
	btAlignedObjectArray<btVector3> deltas;
	btAlignedObjectArray<btScalar> weights;
	deltas.resize(m_nodes.size(),btVector3(0,0,0));
	weights.resize(m_nodes.size(),0);
	int i;

	if(drift)
	{
		for(i=0;i<m_clusters.size();++i)
		{
			Cluster&	c=*m_clusters[i];
			if(c.m_ndimpulses)
			{
				c.m_dimpulses[0]/=(btScalar)c.m_ndimpulses;
				c.m_dimpulses[1]/=(btScalar)c.m_ndimpulses;
			}
		}
	}
	
	for(i=0;i<m_clusters.size();++i)
	{
		Cluster&	c=*m_clusters[i];	
		if(0<(drift?c.m_ndimpulses:c.m_nvimpulses))
		{
			const btVector3		v=(drift?c.m_dimpulses[0]:c.m_vimpulses[0])*m_sst.sdt;
			const btVector3		w=(drift?c.m_dimpulses[1]:c.m_vimpulses[1])*m_sst.sdt;
			for(int j=0;j<c.m_nodes.size();++j)
			{
				const int			idx=int(c.m_nodes[j]-&m_nodes[0]);
				const btVector3&	x=c.m_nodes[j]->m_x;
				const btScalar		q=c.m_masses[j];
				deltas[idx]		+=	(v+btCross(w,x-c.m_com))*q;
				weights[idx]	+=	q;
			}
		}
	}
	for(i=0;i<deltas.size();++i)
	{
		if(weights[i]>0) 
		{
			m_nodes[i].m_x+=deltas[i]/weights[i];
		}
	}
}